

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  undefined1 uVar1;
  bool bVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  UnitTest *__a;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  char *colon;
  char *gtest_output_flag;
  FilePath *in_stack_fffffffffffffd38;
  FilePath *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  FilePath *in_stack_fffffffffffffd50;
  allocator<char> *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  allocator<char> *extension;
  FilePath *in_stack_fffffffffffffd90;
  FilePath *in_stack_fffffffffffffd98;
  string local_238 [8];
  FilePath *in_stack_fffffffffffffdd0;
  FilePath *in_stack_fffffffffffffdd8;
  FilePath local_1f8;
  undefined4 local_1d8;
  allocator<char> local_1d1;
  string local_1d0 [71];
  allocator<char> local_189;
  string local_188 [103];
  allocator<char> local_121;
  string local_120 [32];
  FilePath local_100;
  allocator<char> local_d9;
  string local_d8 [71];
  allocator<char> local_91;
  string local_90 [64];
  FilePath local_50;
  char *local_30;
  allocator<char> local_11;
  char *local_10;
  
  local_10 = (char *)std::__cxx11::string::c_str();
  if (local_10 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,
               (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    local_30 = strchr(local_10,0x3a);
    if (local_30 == (char *)0x0) {
      UnitTest::GetInstance();
      UnitTest::original_working_dir((UnitTest *)0x95726c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,
                 (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd70);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,
                 (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd70);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      FilePath::ConcatPaths(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      psVar3 = FilePath::string_abi_cxx11_(&local_50);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
      FilePath::~FilePath((FilePath *)0x95734b);
      FilePath::~FilePath((FilePath *)0x957358);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      FilePath::~FilePath((FilePath *)0x95737f);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    else {
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_30 + 1);
      extension = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd70);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
      uVar1 = FilePath::IsAbsolutePath(in_stack_fffffffffffffd40);
      if (!(bool)uVar1) {
        __a = UnitTest::GetInstance();
        UnitTest::original_working_dir((UnitTest *)0x957529);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffd78),(allocator<char> *)__a);
        FilePath::FilePath(in_stack_fffffffffffffd50,
                           (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        in_stack_fffffffffffffd50 = (FilePath *)(local_30 + 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffd78),(allocator<char> *)__a);
        FilePath::FilePath(in_stack_fffffffffffffd50,
                           (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        FilePath::ConcatPaths(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        FilePath::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        FilePath::~FilePath((FilePath *)0x957607);
        FilePath::~FilePath((FilePath *)0x957614);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
        FilePath::~FilePath((FilePath *)0x95763b);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator(&local_189);
      }
      bVar2 = FilePath::IsDirectory(in_stack_fffffffffffffd50);
      if (bVar2) {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        std::__cxx11::string::c_str();
        FilePath::GenerateUniqueFileName
                  (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(char *)extension);
        std::__cxx11::string::~string(local_238);
        FilePath::~FilePath((FilePath *)0x957860);
        psVar3 = FilePath::string_abi_cxx11_(&local_1f8);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
        local_1d8 = 1;
        FilePath::~FilePath((FilePath *)0x95789e);
      }
      else {
        psVar3 = FilePath::string_abi_cxx11_(&local_100);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
        local_1d8 = 1;
      }
      FilePath::~FilePath((FilePath *)0x957916);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}